

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_forward_declaration(t_cpp_generator *this,t_struct *tstruct)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  string local_38;
  t_struct *local_18;
  t_struct *tstruct_local;
  t_cpp_generator *this_local;
  
  local_18 = tstruct;
  tstruct_local = (t_struct *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_types_,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,"class ");
  iVar1 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,";");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void t_cpp_generator::generate_forward_declaration(t_struct* tstruct) {
  // Forward declare struct def
  f_types_ << indent() << "class " << tstruct->get_name() << ";" << endl << endl;
}